

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void showMF(string *mySet,MultiFab *mf,string *name,int lev,int iter,int step)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this;
  pointer pcVar2;
  bool bVar3;
  Format fmt;
  const_iterator cVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string junkname;
  string DebugDir;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(anonymous_namespace)::ShowMF_Sets_abi_cxx11_,mySet);
  if (cVar4._M_node != (_Base_ptr)((anonymous_namespace)::ShowMF_Sets_abi_cxx11_ + 8)) {
    fmt = amrex::FArrayBox::getFormat();
    amrex::FArrayBox::setFormat((anonymous_namespace)::ShowMF_Fab_Format);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,(anonymous_namespace)::ShowMF_Dir_abi_cxx11_,
               DAT_00754380 + (anonymous_namespace)::ShowMF_Dir_abi_cxx11_);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      bVar3 = amrex::UtilCreateDirectory(&local_1d8,0x1ed,false);
      if (!bVar3) {
        amrex::CreateDirectoryFailed(&local_1d8);
      }
    }
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + name->_M_string_length);
    paVar1 = &local_218.field_2;
    if (-1 < lev) {
      local_218._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_1f8._M_dataplus._M_p,
                 local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
      std::__cxx11::string::append((char *)&local_218);
      amrex::Concatenate((string *)local_1b8,&local_218,lev,1);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    if (-1 < iter) {
      local_218._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_1f8._M_dataplus._M_p,
                 local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
      std::__cxx11::string::append((char *)&local_218);
      amrex::Concatenate((string *)local_1b8,&local_218,iter,1);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    if (-1 < step) {
      local_218._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_1f8._M_dataplus._M_p,
                 local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
      std::__cxx11::string::append((char *)&local_218);
      amrex::Concatenate((string *)local_1b8,&local_218,step,5);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_1d8._M_dataplus._M_p,
               local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
    std::__cxx11::string::append((char *)&local_218);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_218,(ulong)local_1f8._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_1b8._16_8_ = *psVar6;
      auStack_1a0[0] = plVar5[3];
      local_1b8._0_8_ = local_1b8 + 0x10;
    }
    else {
      local_1b8._16_8_ = *psVar6;
      local_1b8._0_8_ = (size_type *)*plVar5;
    }
    local_1b8._8_8_ = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anonymous_namespace)::ShowMF_Verbose == '\x01') {
      local_1b8._8_8_ = amrex::OutStream();
      this = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this);
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"   ******************************  Debug: writing ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      local_218._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_218,1);
      amrex::Print::~Print((Print *)local_1b8);
    }
    amrex::VisMF::Write(&mf->super_FabArray<amrex::FArrayBox>,&local_1f8,NFiles,false);
    amrex::FArrayBox::setFormat(fmt);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
showMF(const std::string&   mySet,
       const MultiFab&      mf,
       const std::string&   name,
       int                  lev = -1,
       int                  iter = -1, // Default value = no append 2nd integer
       int                  step = -1) // Default value = no append 3nd integer
{
  if (ShowMF_Sets.count(mySet)>0)
  {
    const FABio::Format saved_format = FArrayBox::getFormat();
    FArrayBox::setFormat(ShowMF_Fab_Format);
    std::string DebugDir(ShowMF_Dir);
    if (ParallelDescriptor::IOProcessor())
      if (!amrex::UtilCreateDirectory(DebugDir, 0755))
        amrex::CreateDirectoryFailed(DebugDir);
    ParallelDescriptor::Barrier();

    std::string junkname = name;
    if (lev>=0) {
      junkname = amrex::Concatenate(junkname+"_",lev,1);
    }
    if (iter>=0) {
      junkname = amrex::Concatenate(junkname+"_",iter,1);
    }
    if (step>=0) {
      junkname = amrex::Concatenate(junkname+"_",step,5);
    }
    junkname = DebugDir + "/" + junkname;

    if (ShowMF_Verbose>0) {
      amrex::Print() << "   ******************************  Debug: writing "
             << junkname << '\n';
    }

#if 0
    if (ShowMF_Check_Nans)
    {
      for (MFIter mfi(mf); mfi.isValid(); ++mfi)
      {
        //                AMREX_ASSERT(!mf[mfi].contains_nan(mfi.validbox(),0,mf.nComp()));
      }
    }
#endif
    VisMF::Write(mf,junkname);
    FArrayBox::setFormat(saved_format);
  }
}